

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O2

int zt_ptr_array_del(zt_ptr_array *array,void *data)

{
  long lVar1;
  
  if (data != (void *)0x0 && array != (zt_ptr_array *)0x0) {
    for (lVar1 = 0; lVar1 < array->count; lVar1 = lVar1 + 1) {
      if (array->array[lVar1] == data) {
        zt_ptr_array_move_idx_to_idx(array,array->count + -1,(int32_t)lVar1);
        array->count = array->count + -1;
        if (array->free_cb != (zt_ptr_array_free_cb)0x0) {
          (*array->free_cb)(data);
        }
      }
    }
  }
  return -1;
}

Assistant:

int
zt_ptr_array_del(zt_ptr_array * array, void * data) {
    int32_t i;

    if (array == NULL || data == NULL) {
        return -1;
    }

    for (i = 0; i < array->count; i++) {
        if (array->array[i] == data) {
            zt_ptr_array_move_idx_to_idx(array, array->count - 1, i);
            array->count--;

            if (array->free_cb) {
                array->free_cb(data);
            }
        }
    }

    return -1;
}